

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O0

void __thiscall QOpenGLWindow::~QOpenGLWindow(QOpenGLWindow *this)

{
  bool bVar1;
  QOpenGLWindowPrivate *this_00;
  QOpenGLWindowPaintDevice *in_RDI;
  QOpenGLWindowPrivate *d;
  QOpenGLWindow *in_stack_00000020;
  
  *(undefined ***)&in_RDI->super_QOpenGLPaintDevice = &PTR_metaObject_002144e0;
  (in_RDI->super_QOpenGLPaintDevice).d_ptr.d =
       (QOpenGLPaintDevicePrivate *)&PTR__QOpenGLWindow_00214658;
  *(undefined ***)&in_RDI[1].super_QOpenGLPaintDevice.field_0x8 = &PTR__QOpenGLWindow_00214698;
  this_00 = d_func((QOpenGLWindow *)0x1b660b);
  makeCurrent(in_stack_00000020);
  bVar1 = isValid((QOpenGLWindow *)this_00);
  if (bVar1) {
    QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>::
    reset((QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>
           *)this_00,in_RDI);
    QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>::
    reset((QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>
           *)this_00,(QOpenGLFramebufferObject *)in_RDI);
    QOpenGLTextureBlitter::destroy((QOpenGLTextureBlitter *)this_00);
  }
  doneCurrent((QOpenGLWindow *)this_00);
  QPaintDeviceWindow::~QPaintDeviceWindow((QPaintDeviceWindow *)this_00);
  return;
}

Assistant:

QOpenGLWindow::~QOpenGLWindow()
{
    Q_D(QOpenGLWindow);

    makeCurrent(); // this works even when the platformwindow is destroyed
    if (isValid()) {
        d->paintDevice.reset(nullptr);
        d->fbo.reset(nullptr);
        d->blitter.destroy();
    }
    doneCurrent();
}